

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

StringRef __thiscall llvm::ARM::getCanonicalArchName(ARM *this,StringRef Arch)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  StringRef Str;
  StringRef Str_00;
  StringRef SVar9;
  StringRef local_38;
  
  pcVar5 = Arch.Data;
  pcVar6 = pcVar5;
  local_38.Data = (char *)this;
  local_38.Length = (size_t)pcVar5;
  if (pcVar5 < (char *)0x5) {
    if (pcVar5 < (char *)0x3) {
      pcVar8 = (char *)0xffffffffffffffff;
      goto LAB_001a547f;
    }
LAB_001a537a:
    pcVar7 = (char *)0x3;
    iVar2 = bcmp(this,"arm",3);
    if (iVar2 == 0) goto LAB_001a5459;
    pcVar8 = (char *)0xffffffffffffffff;
    if (pcVar5 < (char *)0x5) goto LAB_001a5488;
    pcVar7 = (char *)0x5;
    iVar2 = bcmp(this,"thumb",5);
    if (iVar2 == 0) goto LAB_001a5459;
    if (pcVar5 < (char *)0x7) {
LAB_001a5488:
      if (*(short *)((ARM *)(local_38.Data + -2) + (long)pcVar6) == 0x6265) {
        pcVar6 = pcVar6 + -2;
      }
      goto LAB_001a54a0;
    }
    pcVar7 = (char *)0x7;
    iVar2 = bcmp(this,"aarch64",7);
    if (iVar2 != 0) goto LAB_001a5488;
    Str.Length = 2;
    Str.Data = "eb";
    sVar3 = StringRef::find(&local_38,Str,0);
    pcVar6 = (char *)local_38.Length;
    if (sVar3 == 0xffffffffffffffff) {
      pcVar8 = pcVar7;
      if (local_38.Length < (char *)0x7) {
        pcVar8 = (char *)local_38.Length;
      }
      if (2 < local_38.Length - (long)pcVar8) {
        iVar2 = bcmp(pcVar8 + (long)local_38.Data,"_be",3);
        pcVar7 = (char *)((ulong)(iVar2 == 0) * 3 + 7);
      }
      goto LAB_001a5459;
    }
LAB_001a5521:
    this = (ARM *)0x1dca0f;
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar7 = (char *)0x5;
    iVar2 = bcmp(this,"arm64",5);
    if (iVar2 != 0) goto LAB_001a537a;
LAB_001a5459:
    pcVar4 = pcVar7;
    if (pcVar6 < pcVar7) {
      pcVar4 = pcVar6;
    }
    pcVar8 = pcVar7;
    if (((ulong)((long)pcVar6 - (long)pcVar4) < 2) ||
       (*(short *)(local_38.Data + (long)pcVar4) != 0x6265)) {
LAB_001a547f:
      if ((char *)0x1 < pcVar6) goto LAB_001a5488;
LAB_001a54a0:
      if (pcVar8 != (char *)0xffffffffffffffff) goto LAB_001a54aa;
      if (pcVar6 == (char *)0x0) goto LAB_001a5531;
    }
    else {
      pcVar8 = pcVar7 + 2;
LAB_001a54aa:
      if (pcVar6 < pcVar8) {
        pcVar8 = pcVar6;
      }
      local_38.Data = (char *)((ARM *)local_38.Data + (long)pcVar8);
      local_38.Length = (size_t)(pcVar6 + -(long)pcVar8);
      if ((char *)local_38.Length == (char *)0x0) goto LAB_001a5531;
      if ((char *)local_38.Length != (char *)0x1) {
        pcVar5 = (char *)0x0;
        cVar1 = StringRef::operator[](&local_38,0);
        this = (ARM *)0x1dca0f;
        if (cVar1 != 'v') goto LAB_001a5531;
        cVar1 = StringRef::operator[](&local_38,1);
        if (9 < (int)cVar1 - 0x30U) goto LAB_001a5521;
      }
      pcVar5 = (char *)0x0;
      Str_00.Length = 2;
      Str_00.Data = "eb";
      sVar3 = StringRef::find(&local_38,Str_00,0);
      pcVar6 = (char *)local_38.Length;
      if (sVar3 != 0xffffffffffffffff) {
        this = (ARM *)0x1dca0f;
        goto LAB_001a5531;
      }
    }
    pcVar5 = pcVar6;
    this = (ARM *)local_38.Data;
  }
LAB_001a5531:
  SVar9.Length = (size_t)pcVar5;
  SVar9.Data = (char *)this;
  return SVar9;
}

Assistant:

StringRef llvm::ARM::getCanonicalArchName(StringRef Arch) {
  size_t offset = StringRef::npos;
  StringRef A = Arch;
  StringRef Error = "";

  // Begins with "arm" / "thumb", move past it.
  if (A.startswith("arm64"))
    offset = 5;
  else if (A.startswith("arm"))
    offset = 3;
  else if (A.startswith("thumb"))
    offset = 5;
  else if (A.startswith("aarch64")) {
    offset = 7;
    // AArch64 uses "_be", not "eb" suffix.
    if (A.find("eb") != StringRef::npos)
      return Error;
    if (A.substr(offset, 3) == "_be")
      offset += 3;
  }

  // Ex. "armebv7", move past the "eb".
  if (offset != StringRef::npos && A.substr(offset, 2) == "eb")
    offset += 2;
  // Or, if it ends with eb ("armv7eb"), chop it off.
  else if (A.endswith("eb"))
    A = A.substr(0, A.size() - 2);
  // Trim the head
  if (offset != StringRef::npos)
    A = A.substr(offset);

  // Empty string means offset reached the end, which means it's valid.
  if (A.empty())
    return Arch;

  // Only match non-marketing names
  if (offset != StringRef::npos) {
    // Must start with 'vN'.
    if (A.size() >= 2 && (A[0] != 'v' || !std::isdigit(A[1])))
      return Error;
    // Can't have an extra 'eb'.
    if (A.find("eb") != StringRef::npos)
      return Error;
  }

  // Arch will either be a 'v' name (v7a) or a marketing name (xscale).
  return A;
}